

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

VRle __thiscall VRle::operator&(VRle *this,VRle *o)

{
  bool bVar1;
  size_t in_RCX;
  vcow_ptr<VRle::Data> *in_RDX;
  int iVar2;
  vcow_ptr<VRle::Data> *in_RSI;
  vcow_ptr<VRle::Data> *pvVar3;
  model *in_RDI;
  undefined1 auVar4 [16];
  View VVar5;
  View VVar6;
  VRle *result;
  Data *in_stack_000007b0;
  View in_stack_000007b8;
  View in_stack_000007c8;
  Data *pDVar7;
  Data *in_stack_ffffffffffffffa0;
  Data *this_00;
  vcow_ptr<VRle::Data> this_01;
  undefined8 local_38;
  
  pvVar3 = in_RSI;
  this_01.mModel = in_RDI;
  bVar1 = empty((VRle *)0x12388f);
  iVar2 = (int)pvVar3;
  if ((bVar1) || (bVar1 = empty((VRle *)0x12389d), bVar1)) {
    memset(in_RDI,0,8);
    VRle((VRle *)0x1238be);
  }
  else {
    _ZTWL14Scratch_Object();
    Data::reset((Data *)this_01.mModel);
    auVar4 = _ZTWL14Scratch_Object();
    pDVar7 = auVar4._0_8_;
    vcow_ptr<VRle::Data>::read(in_RSI,iVar2,auVar4._8_8_,in_RCX);
    VVar5 = Data::view(in_stack_ffffffffffffffa0);
    vcow_ptr<VRle::Data>::read(in_RDX,iVar2,(void *)VVar5._size,in_RCX);
    VVar6 = Data::view(in_stack_ffffffffffffffa0);
    iVar2 = (int)VVar5._data;
    local_38 = VVar6._data;
    Data::opIntersect(in_stack_000007b0,in_stack_000007c8,in_stack_000007b8);
    VRle((VRle *)0x12393d);
    auVar4 = _ZTWL14Scratch_Object();
    this_00 = auVar4._0_8_;
    vcow_ptr<VRle::Data>::write((vcow_ptr<VRle::Data> *)in_RDI,iVar2,auVar4._8_8_,(size_t)local_38);
    Data::operator=(this_00,pDVar7);
  }
  return (VRle)(vcow_ptr<VRle::Data>)this_01.mModel;
}

Assistant:

VRle VRle::operator&(const VRle &o) const
{
    if (empty() || o.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.opIntersect(d.read().view(), o.d.read().view());

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}